

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZDICT_addEntropyTablesFromBuffer_advanced
                 (void *dictBuffer,size_t dictContentSize,size_t dictBufferCapacity,
                 void *samplesBuffer,size_t *samplesSizes,uint nbSamples,ZDICT_params_t params)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  xxh_u8 *dictBuffer_00;
  size_t sVar4;
  xxh_u64 xVar5;
  ulong uVar6;
  ulong uVar7;
  int compressionLevel;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  xxh_u8 *ptr;
  long lVar15;
  
  compressionLevel = 3;
  if (params.compressionLevel != 0) {
    compressionLevel = params.compressionLevel;
  }
  if (1 < params.notificationLevel) {
    ZDICT_addEntropyTablesFromBuffer_advanced_cold_1();
  }
  dictBuffer_00 = (xxh_u8 *)((long)dictBuffer + (dictBufferCapacity - dictContentSize));
  sVar4 = ZDICT_analyzeEntropy
                    ((void *)((long)dictBuffer + 8),dictBufferCapacity - 8,compressionLevel,
                     samplesBuffer,samplesSizes,nbSamples,dictBuffer_00,dictContentSize,
                     params.notificationLevel);
  uVar1 = sVar4 + 8;
  if (sVar4 < 0xffffffffffffff89) {
    *(undefined4 *)dictBuffer = 0xec30a437;
    if (dictContentSize < 0x20) {
      lVar11 = 0x27d4eb2f165667c5;
      uVar6 = uVar1;
      ptr = dictBuffer_00;
    }
    else {
      uVar12 = 0x61c8864e7a143579;
      lVar14 = 0x60ea27eeadc0b5d6;
      uVar6 = 0;
      uVar13 = 0xc2b2ae3d27d4eb4f;
      lVar11 = -dictContentSize;
      do {
        uVar8 = *(long *)((long)dictBuffer + lVar11 + dictBufferCapacity) * -0x3d4d51c2d82b14b1 +
                lVar14;
        uVar9 = uVar8 * 0x80000000 | uVar8 >> 0x21;
        lVar14 = uVar9 * -0x61c8864e7a143579;
        uVar13 = *(long *)((long)dictBuffer + lVar11 + dictBufferCapacity + 8) * -0x3d4d51c2d82b14b1
                 + uVar13;
        uVar7 = uVar13 * 0x80000000 | uVar13 >> 0x21;
        uVar6 = *(long *)((long)dictBuffer + lVar11 + dictBufferCapacity + 0x10) *
                -0x3d4d51c2d82b14b1 + uVar6;
        uVar8 = uVar6 * 0x80000000 | uVar6 >> 0x21;
        uVar13 = uVar7 * -0x61c8864e7a143579;
        uVar6 = uVar8 * -0x61c8864e7a143579;
        uVar12 = *(long *)((long)dictBuffer + lVar11 + dictBufferCapacity + 0x18) *
                 -0x3d4d51c2d82b14b1 + uVar12;
        uVar10 = uVar12 * 0x80000000 | uVar12 >> 0x21;
        uVar12 = uVar10 * -0x61c8864e7a143579;
        lVar15 = lVar11 + 0x20;
        bVar2 = lVar11 < -0x3f;
        lVar11 = lVar15;
      } while (bVar2);
      uVar6 = ((uVar8 * -0x784349ab80000000 | uVar8 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^
              ((uVar7 * -0x784349ab80000000 | uVar7 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^
              ((uVar9 * -0x784349ab80000000 | uVar9 * -0x210ca4fef0869357 >> 0x21) *
               -0x61c8864e7a143579 ^
              (uVar10 * -0x1939e850d5e40000 | uVar12 >> 0x2e) +
              (uVar8 * 0x779b185ebca87000 | uVar6 >> 0x34) +
              (uVar7 * 0x1bbcd8c2f5e54380 | uVar13 >> 0x39) +
              (uVar9 * 0x3c6ef3630bd7950e | (ulong)(lVar14 < 0))) * -0x61c8864e7a143579 +
              0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579
              + 0x85ebca77c2b2ae63;
      lVar11 = ((uVar10 * -0x784349ab80000000 | uVar10 * -0x210ca4fef0869357 >> 0x21) *
                -0x61c8864e7a143579 ^ uVar6) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
      ptr = (xxh_u8 *)((long)dictBuffer + lVar15 + dictBufferCapacity);
    }
    xVar5 = XXH64_finalize(lVar11 + dictContentSize,ptr,dictContentSize,(XXH_alignment)uVar6);
    uVar3 = (int)xVar5 + (int)(xVar5 / 0x7fff8000) * -0x7fff8000 + 0x8000;
    if (params.dictID != 0) {
      uVar3 = params.dictID;
    }
    *(uint *)((long)dictBuffer + 4) = uVar3;
    sVar4 = dictBufferCapacity;
    if (dictContentSize + uVar1 < dictBufferCapacity) {
      memmove((void *)((long)dictBuffer + uVar1),dictBuffer_00,dictContentSize);
      sVar4 = dictContentSize + uVar1;
    }
  }
  return sVar4;
}

Assistant:

static size_t ZDICT_addEntropyTablesFromBuffer_advanced(
        void* dictBuffer, size_t dictContentSize, size_t dictBufferCapacity,
        const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
        ZDICT_params_t params)
{
    int const compressionLevel = (params.compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : params.compressionLevel;
    U32 const notificationLevel = params.notificationLevel;
    size_t hSize = 8;

    /* calculate entropy tables */
    DISPLAYLEVEL(2, "\r%70s\r", "");   /* clean display line */
    DISPLAYLEVEL(2, "statistics ... \n");
    {   size_t const eSize = ZDICT_analyzeEntropy((char*)dictBuffer+hSize, dictBufferCapacity-hSize,
                                  compressionLevel,
                                  samplesBuffer, samplesSizes, nbSamples,
                                  (char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize,
                                  notificationLevel);
        if (ZDICT_isError(eSize)) return eSize;
        hSize += eSize;
    }

    /* add dictionary header (after entropy tables) */
    MEM_writeLE32(dictBuffer, ZSTD_MAGIC_DICTIONARY);
    {   U64 const randomID = XXH64((char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize, 0);
        U32 const compliantID = (randomID % ((1U<<31)-32768)) + 32768;
        U32 const dictID = params.dictID ? params.dictID : compliantID;
        MEM_writeLE32((char*)dictBuffer+4, dictID);
    }

    if (hSize + dictContentSize < dictBufferCapacity)
        memmove((char*)dictBuffer + hSize, (char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize);
    return MIN(dictBufferCapacity, hSize+dictContentSize);
}